

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::DeadBranchElimPass::GetConstInteger
          (DeadBranchElimPass *this,uint32_t selId,uint32_t *selVal)

{
  uint32_t uVar1;
  uint32_t uVar2;
  DefUseManager *pDVar3;
  Instruction *this_00;
  Instruction *this_01;
  
  pDVar3 = Pass::get_def_use_mgr((Pass *)this);
  this_00 = analysis::DefUseManager::GetDef(pDVar3,selId);
  uVar1 = Instruction::type_id(this_00);
  pDVar3 = Pass::get_def_use_mgr((Pass *)this);
  this_01 = analysis::DefUseManager::GetDef(pDVar3,uVar1);
  if ((this_01 == (Instruction *)0x0) || (this_01->opcode_ != OpTypeInt)) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    uVar2 = Instruction::GetSingleWordInOperand(this_01,0);
    if (uVar2 == 0x20) {
      if (this_00->opcode_ != OpConstantNull) {
        if (this_00->opcode_ != OpConstant) goto LAB_004d1770;
        uVar1 = Instruction::GetSingleWordInOperand(this_00,0);
      }
      *selVal = uVar1;
      uVar1 = 1;
    }
  }
LAB_004d1770:
  return SUB41(uVar1,0);
}

Assistant:

bool DeadBranchElimPass::GetConstInteger(uint32_t selId, uint32_t* selVal) {
  Instruction* sInst = get_def_use_mgr()->GetDef(selId);
  uint32_t typeId = sInst->type_id();
  Instruction* typeInst = get_def_use_mgr()->GetDef(typeId);
  if (!typeInst || (typeInst->opcode() != spv::Op::OpTypeInt)) return false;
  // TODO(greg-lunarg): Support non-32 bit ints
  if (typeInst->GetSingleWordInOperand(0) != 32) return false;
  if (sInst->opcode() == spv::Op::OpConstant) {
    *selVal = sInst->GetSingleWordInOperand(0);
    return true;
  } else if (sInst->opcode() == spv::Op::OpConstantNull) {
    *selVal = 0;
    return true;
  }
  return false;
}